

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O2

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  uv_loop_t *loop;
  __dev_t _Var2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_b_4;
  stat stat_buf;
  uv_pipe_t pipe_handle;
  
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,&pipe_handle,0);
  _Var2 = (__dev_t)iVar1;
  eval_b = 0;
  stat_buf.st_dev = _Var2;
  if (_Var2 == 0) {
    iVar1 = uv_pipe_bind(&pipe_handle,"/tmp/uv-test-sock");
    _Var2 = (__dev_t)iVar1;
    eval_b = 0;
    stat_buf.st_dev = _Var2;
    if (_Var2 == 0) {
      iVar1 = uv_pipe_chmod(&pipe_handle,1);
      if (iVar1 == -1) {
        close_loop(loop);
        stat_buf.st_dev = 0;
        iVar1 = uv_loop_close(loop);
        if (stat_buf.st_dev == (long)iVar1) {
          uv_library_shutdown();
          fprintf(_stderr,"%s\n","Insufficient privileges to alter pipe fmode");
          fflush(_stderr);
          return 7;
        }
        pcVar4 = "uv_loop_close(loop)";
        pcVar3 = "0";
        uVar5 = 0x2f;
        _Var2 = stat_buf.st_dev;
        eval_b_4 = (long)iVar1;
      }
      else {
        stat_buf.st_dev = (__dev_t)iVar1;
        eval_b = 0;
        if (stat_buf.st_dev == 0) {
          memset(&stat_buf,0,0x90);
          iVar1 = stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
          _Var2 = (__dev_t)iVar1;
          eval_b_4 = 0;
          if (_Var2 == 0) {
            if ((stat_buf.st_mode >> 8 & 1) == 0) {
              pcVar3 = "stat_buf.st_mode & S_IRUSR";
              uVar5 = 0x36;
            }
            else if ((stat_buf.st_mode & 0x20) == 0) {
              pcVar3 = "stat_buf.st_mode & S_IRGRP";
              uVar5 = 0x37;
            }
            else if ((stat_buf.st_mode & 4) == 0) {
              pcVar3 = "stat_buf.st_mode & S_IROTH";
              uVar5 = 0x38;
            }
            else {
              iVar1 = uv_pipe_chmod(&pipe_handle,2);
              _Var2 = (__dev_t)iVar1;
              eval_b_4 = 0;
              if (_Var2 != 0) {
                pcVar4 = "0";
                pcVar3 = "r";
                uVar5 = 0x3c;
                goto LAB_00160c01;
              }
              stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
              if ((char)stat_buf.st_mode < '\0') {
                if ((stat_buf.st_mode & 0x10) == 0) {
                  pcVar3 = "stat_buf.st_mode & S_IWGRP";
                  uVar5 = 0x40;
                }
                else if ((stat_buf.st_mode & 2) == 0) {
                  pcVar3 = "stat_buf.st_mode & S_IWOTH";
                  uVar5 = 0x41;
                }
                else {
                  iVar1 = uv_pipe_chmod(&pipe_handle,3);
                  _Var2 = (__dev_t)iVar1;
                  eval_b_4 = 0;
                  if (_Var2 != 0) {
                    pcVar4 = "0";
                    pcVar3 = "r";
                    uVar5 = 0x45;
                    goto LAB_00160c01;
                  }
                  stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
                  if ((stat_buf.st_mode >> 8 & 1) == 0) {
                    pcVar3 = "stat_buf.st_mode & S_IRUSR";
                    uVar5 = 0x48;
                  }
                  else if ((stat_buf.st_mode & 0x20) == 0) {
                    pcVar3 = "stat_buf.st_mode & S_IRGRP";
                    uVar5 = 0x49;
                  }
                  else if ((stat_buf.st_mode & 4) == 0) {
                    pcVar3 = "stat_buf.st_mode & S_IROTH";
                    uVar5 = 0x4a;
                  }
                  else if ((char)stat_buf.st_mode < '\0') {
                    if ((stat_buf.st_mode & 0x10) == 0) {
                      pcVar3 = "stat_buf.st_mode & S_IWGRP";
                      uVar5 = 0x4c;
                    }
                    else {
                      if ((stat_buf.st_mode & 2) != 0) {
                        iVar1 = uv_pipe_chmod((uv_pipe_t *)0x0,3);
                        _Var2 = (__dev_t)iVar1;
                        eval_b_4 = -9;
                        if (_Var2 == 0xfffffffffffffff7) {
                          iVar1 = uv_pipe_chmod(&pipe_handle,0xbc614e);
                          _Var2 = (__dev_t)iVar1;
                          eval_b_4 = -0x16;
                          if (_Var2 == 0xffffffffffffffea) {
                            uv_close((uv_handle_t *)&pipe_handle,(uv_close_cb)0x0);
                            iVar1 = uv_pipe_chmod(&pipe_handle,3);
                            _Var2 = (__dev_t)iVar1;
                            eval_b_4 = -9;
                            if (_Var2 == 0xfffffffffffffff7) {
                              close_loop(loop);
                              eval_b = 0;
                              iVar1 = uv_loop_close(loop);
                              eval_b_4 = (int64_t)iVar1;
                              if (eval_b_4 == 0) {
                                uv_library_shutdown();
                                return 0;
                              }
                              pcVar4 = "uv_loop_close(loop)";
                              pcVar3 = "0";
                              uVar5 = 0x5a;
                              _Var2 = eval_b;
                            }
                            else {
                              pcVar4 = "UV_EBADF";
                              pcVar3 = "r";
                              uVar5 = 0x58;
                            }
                          }
                          else {
                            pcVar4 = "UV_EINVAL";
                            pcVar3 = "r";
                            uVar5 = 0x54;
                          }
                        }
                        else {
                          pcVar4 = "UV_EBADF";
                          pcVar3 = "r";
                          uVar5 = 0x51;
                        }
                        goto LAB_00160c01;
                      }
                      pcVar3 = "stat_buf.st_mode & S_IWOTH";
                      uVar5 = 0x4d;
                    }
                  }
                  else {
                    pcVar3 = "stat_buf.st_mode & S_IWUSR";
                    uVar5 = 0x4b;
                  }
                }
              }
              else {
                pcVar3 = "stat_buf.st_mode & S_IWUSR";
                uVar5 = 0x3f;
              }
            }
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
                    ,uVar5,pcVar3);
            abort();
          }
          pcVar4 = "0";
          pcVar3 = "stat(\"/tmp/uv-test-sock\", &stat_buf)";
          uVar5 = 0x35;
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x32;
          _Var2 = stat_buf.st_dev;
          eval_b_4 = eval_b;
        }
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x29;
      eval_b_4 = eval_b;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar5 = 0x26;
    eval_b_4 = eval_b;
  }
LAB_00160c01:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
          ,uVar5,pcVar3,"==",pcVar4,_Var2,"==",eval_b_4);
  abort();
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY(loop);
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT_OK(r);
#ifndef _WIN32
  memset(&stat_buf, 0, sizeof(stat_buf));
  ASSERT_OK(stat(TEST_PIPENAME, &stat_buf));
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}